

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-3AddBeforeQuery.cpp
# Opt level: O0

void AddPolygonFromAddBeforeQuery
               (int id,int n,
               vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               *polygon)

{
  bool bVar1;
  iterator a_max;
  iterator a_dataId;
  reference ppVar2;
  reference pvVar3;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  int i;
  Rect R;
  pair<double,_double> now;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *__range1;
  double mxy;
  double mxx;
  double mny;
  double mnx;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar4;
  Rect local_78;
  double local_58;
  RTree<int,_double,_2,_double,_8,_4> *local_50;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *a_min;
  RTree<int,_double,_2,_double,_8,_4> *this;
  double local_28;
  RTree<int,_double,_2,_double,_8,_4> *local_20;
  double local_18;
  
  local_18 = 5000000.0;
  local_20 = (RTree<int,_double,_2,_double,_8,_4> *)0x415312d000000000;
  local_28 = -5000000.0;
  this = (RTree<int,_double,_2,_double,_8,_4> *)0xc15312d000000000;
  a_min = in_RDX;
  a_max = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::begin
                    (in_stack_ffffffffffffff78);
  a_dataId = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
             ::operator*((__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                          *)&stack0xffffffffffffffc0);
    local_58 = ppVar2->first;
    local_50 = (RTree<int,_double,_2,_double,_8,_4> *)ppVar2->second;
    if (local_58 < local_18) {
      local_18 = local_58;
    }
    if ((double)local_50 < (double)local_20) {
      local_20 = local_50;
    }
    if (local_28 < local_58) {
      local_28 = local_58;
    }
    if ((double)this < (double)local_50) {
      this = local_50;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
    ::operator++((__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  Rect::Rect(&local_78,local_18,(double)local_20,local_28,(double)this);
  RTree<int,_double,_2,_double,_8,_4>::Insert
            (this,(double *)a_min,&(a_max._M_current)->first,(int *)a_dataId._M_current);
  for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
    pvVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](in_RDX,(long)iVar4);
    pgon[iVar4][0] = pvVar3->first;
    pvVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](in_RDX,(long)iVar4);
    pgon[iVar4][1] = pvVar3->second;
  }
  GridSetup((double (*) [2])CONCAT44(id,n),polygon._4_4_,(int)polygon,(pGridSet)mnx);
  Poly_id[Poly_cnt] = in_EDI;
  Poly_cnt = Poly_cnt + 1;
  return;
}

Assistant:

void AddPolygonFromAddBeforeQuery(int id, int n, std::vector<std::pair<double, double> > &polygon) {
    double mnx = MAX_POS, mny = MAX_POS, mxx = -MAX_POS, mxy = -MAX_POS;
    for (auto now : polygon)
    {
        if (now.first < mnx) mnx = now.first;
        if (now.second < mny) mny = now.second;
        if (now.first > mxx) mxx = now.first;
        if (now.second > mxy) mxy = now.second;
    }
    Rect R = Rect(mnx, mny, mxx, mxy);
    Rtree.Insert(R.min, R.max, Poly_cnt);

    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &PolyGrid[Poly_cnt]);
    Poly_id[Poly_cnt] = id;
    Poly_cnt ++;
}